

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmeth_check.c
# Opt level: O0

int evp_pkey_public_check_combined(EVP_PKEY_CTX *ctx,int checktype)

{
  int iVar1;
  int in_ESI;
  char *in_RDI;
  int ok;
  EVP_PKEY *pkey;
  int *func;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  func = *(int **)(in_RDI + 0x88);
  if (func == (int *)0x0) {
    ERR_new();
    ERR_set_debug(in_RDI,in_ESI,(char *)func);
    ERR_set_error(6,0x9a,(char *)0x0);
    local_4 = 0;
  }
  else {
    local_4 = try_provided_check((EVP_PKEY_CTX *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                 (int)((ulong)func >> 0x20),(int)func);
    if (local_4 == -1) {
      if (*func != 0) {
        if (*(long *)(*(long *)(in_RDI + 0x78) + 0xe8) != 0) {
          iVar1 = (**(code **)(*(long *)(in_RDI + 0x78) + 0xe8))(func);
          return iVar1;
        }
        if ((*(long *)(func + 2) != 0) && (*(long *)(*(long *)(func + 2) + 0xe8) != 0)) {
          iVar1 = (**(code **)(*(long *)(func + 2) + 0xe8))(func);
          return iVar1;
        }
      }
      ERR_new();
      ERR_set_debug(in_RDI,in_ESI,(char *)func);
      ERR_set_error(6,0x96,(char *)0x0);
      local_4 = -2;
    }
  }
  return local_4;
}

Assistant:

static int evp_pkey_public_check_combined(EVP_PKEY_CTX *ctx, int checktype)
{
    EVP_PKEY *pkey = ctx->pkey;
    int ok;

    if (pkey == NULL) {
        ERR_raise(ERR_LIB_EVP, EVP_R_NO_KEY_SET);
        return 0;
    }

    if ((ok = try_provided_check(ctx, OSSL_KEYMGMT_SELECT_PUBLIC_KEY,
                                 checktype)) != -1)
        return ok;

    if (pkey->type == EVP_PKEY_NONE)
        goto not_supported;

#ifndef FIPS_MODULE
    /* legacy */
    /* call customized public key check function first */
    if (ctx->pmeth->public_check != NULL)
        return ctx->pmeth->public_check(pkey);

    /* use default public key check function in ameth */
    if (pkey->ameth == NULL || pkey->ameth->pkey_public_check == NULL)
        goto not_supported;

    return pkey->ameth->pkey_public_check(pkey);
#endif
 not_supported:
    ERR_raise(ERR_LIB_EVP, EVP_R_OPERATION_NOT_SUPPORTED_FOR_THIS_KEYTYPE);
    return -2;
}